

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

Value * __thiscall Kvm::extendEnvironment(Kvm *this,Value *vars,Value *vals,Value *base_env)

{
  Value *local_30;
  Value *result;
  Value *base_env_local;
  Value *vals_local;
  Value *vars_local;
  Kvm *this_local;
  
  local_30 = (Value *)0x0;
  result = base_env;
  base_env_local = vals;
  vals_local = vars;
  vars_local = (Value *)this;
  Kgc::pushLocalStackRoot(&this->gc_,&local_30);
  local_30 = makeFrame(this,vals_local,base_env_local);
  local_30 = makeCell(this,local_30,result);
  Kgc::popLocalStackRoot(&this->gc_);
  return local_30;
}

Assistant:

const Value* Kvm::extendEnvironment(const Value *vars, const Value *vals, const Value *base_env)
{
    const Value *result = nullptr;
    gc_.pushLocalStackRoot(&result);
    
    result = makeFrame(vars, vals);
    result = makeCell(result, base_env);
    
    gc_.popLocalStackRoot();
    return result;
}